

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::HasProperty(RecyclableObject *instance,PropertyId propertyId)

{
  int iVar1;
  
  while( true ) {
    if (((instance->type).ptr)->typeId == TypeIds_Null) {
      return 0;
    }
    iVar1 = (*(instance->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0xb])(instance,(ulong)(uint)propertyId,0);
    if (iVar1 != 0) break;
    instance = GetPrototypeNoTrap(instance);
  }
  return (uint)(iVar1 == 1);
}

Assistant:

BOOL JavascriptOperators::HasProperty(RecyclableObject* instance, PropertyId propertyId)
    {
        while (!JavascriptOperators::IsNull(instance))
        {
            PropertyQueryFlags result = instance->HasPropertyQuery(propertyId, nullptr /*info*/);
            if (result != PropertyQueryFlags::Property_NotFound)
            {
                return JavascriptConversion::PropertyQueryFlagsToBoolean(result); // return false if instance is typed array and HasPropertyQuery() returns PropertyQueryFlags::Property_Found_Undefined
            }

            instance = JavascriptOperators::GetPrototypeNoTrap(instance);
        }
        return false;
    }